

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O0

void Gia_ManQuantSetSuppCi(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Wrd_t *p_00;
  word Entry;
  word *p_01;
  int local_3c;
  Vec_Wrd_t *vTemp;
  int local_28;
  int Size;
  int Count;
  int w;
  word Data;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsCi(pObj);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsCi(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                  ,0x77,"void Gia_ManQuantSetSuppCi(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->vSuppWords != (Vec_Wrd_t *)0x0) {
    if (p->iSuppPi == p->nSuppWords << 6) {
      local_28 = 0;
      local_3c = Vec_WrdSize(p->vSuppWords);
      if (local_3c == 0) {
        local_3c = 1000;
      }
      else {
        local_3c = local_3c << 1;
      }
      p_00 = Vec_WrdAlloc(local_3c);
      for (Size = 0; iVar1 = Vec_WrdSize(p->vSuppWords), Size < iVar1; Size = Size + 1) {
        Entry = Vec_WrdEntry(p->vSuppWords,Size);
        Vec_WrdPush(p_00,Entry);
        local_28 = local_28 + 1;
        if (local_28 == p->nSuppWords) {
          Vec_WrdPush(p_00,0);
          local_28 = 0;
        }
      }
      Vec_WrdFree(p->vSuppWords);
      p->vSuppWords = p_00;
      p->nSuppWords = p->nSuppWords + 1;
      iVar2 = Vec_WrdSize(p->vSuppWords);
      iVar1 = p->nSuppWords;
      iVar3 = Gia_ManObjNum(p);
      if (iVar2 != iVar1 * iVar3) {
        __assert_fail("Vec_WrdSize(p->vSuppWords) == p->nSuppWords * Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                      ,0x89,"void Gia_ManQuantSetSuppCi(Gia_Man_t *, Gia_Obj_t *)");
      }
    }
    iVar1 = p->iSuppPi;
    iVar2 = Vec_IntSize(&p->vSuppVars);
    if (iVar1 == iVar2) {
      iVar1 = Gia_ObjCioId(pObj);
      Vec_IntPush(&p->vSuppVars,iVar1);
      p_01 = Gia_ManQuantInfo(p,pObj);
      iVar1 = p->iSuppPi;
      p->iSuppPi = iVar1 + 1;
      Abc_TtSetBit(p_01,iVar1);
      return;
    }
    __assert_fail("p->iSuppPi == Vec_IntSize(&p->vSuppVars)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                  ,0x8c,"void Gia_ManQuantSetSuppCi(Gia_Man_t *, Gia_Obj_t *)");
  }
  __assert_fail("p->vSuppWords != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                ,0x78,"void Gia_ManQuantSetSuppCi(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManQuantSetSuppCi( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    assert( Gia_ObjIsCi(pObj) );
    assert( p->vSuppWords != NULL );
    if ( p->iSuppPi == 64 * p->nSuppWords )
    {
        word Data; int w, Count = 0, Size = Vec_WrdSize(p->vSuppWords);
        Vec_Wrd_t * vTemp = Vec_WrdAlloc( Size ? 2 * Size : 1000 ); 
        Vec_WrdForEachEntry( p->vSuppWords, Data, w )
        {
            Vec_WrdPush( vTemp, Data );
            if ( ++Count == p->nSuppWords )
            {
                Vec_WrdPush( vTemp, 0 );
                Count = 0;
            }
        }
        Vec_WrdFree( p->vSuppWords );
        p->vSuppWords = vTemp;
        p->nSuppWords++;
        assert( Vec_WrdSize(p->vSuppWords) == p->nSuppWords * Gia_ManObjNum(p) );
        //printf( "Resizing to %d words.\n", p->nSuppWords );
    }
    assert( p->iSuppPi == Vec_IntSize(&p->vSuppVars) );
    Vec_IntPush( &p->vSuppVars, Gia_ObjCioId(pObj) );
    Abc_TtSetBit( Gia_ManQuantInfo(p, pObj), p->iSuppPi++ );
}